

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O2

void init_once(void)

{
  int iVar1;
  char *__nptr;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  uv_sem_t uStack_48;
  
  iVar1 = pthread_atfork((__prepare *)0x0,(__parent *)0x0,reset_once);
  if (iVar1 != 0) goto LAB_003d0297;
  nthreads = 4;
  __nptr = getenv("UV_THREADPOOL_SIZE");
  if (__nptr == (char *)0x0) {
LAB_003d01d9:
    threads = default_threads;
  }
  else {
    nthreads = atoi(__nptr);
    if (nthreads == 0) {
      nthreads = 1;
      goto LAB_003d01d9;
    }
    if (nthreads < 0x81) {
      threads = default_threads;
      if (4 < nthreads) goto LAB_003d01b9;
    }
    else {
      nthreads = 0x80;
LAB_003d01b9:
      threads = default_threads;
      threads = (uv_thread_t *)uv__malloc((ulong)(nthreads << 3));
      if (threads == (uv_thread_t *)0x0) {
        nthreads = 4;
        goto LAB_003d01d9;
      }
    }
  }
  iVar1 = uv_cond_init(&cond);
  if ((iVar1 == 0) && (iVar1 = uv_mutex_init(&mutex), iVar1 == 0)) {
    wq[0] = wq;
    wq[1] = wq;
    slow_io_pending_wq[0] = slow_io_pending_wq;
    slow_io_pending_wq[1] = slow_io_pending_wq;
    run_slow_work_message[0] = run_slow_work_message;
    run_slow_work_message[1] = run_slow_work_message;
    iVar1 = uv_sem_init(&uStack_48,0);
    if (iVar1 == 0) {
      uVar5 = 0xffffffffffffffff;
      lVar4 = 0;
      do {
        uVar2 = (ulong)nthreads;
        uVar5 = uVar5 + 1;
        if (uVar2 <= uVar5) {
          for (uVar3 = 0; uVar3 < (uint)uVar2; uVar3 = uVar3 + 1) {
            uv_sem_wait(&uStack_48);
            uVar2 = (ulong)nthreads;
          }
          uv_sem_destroy(&uStack_48);
          return;
        }
        iVar1 = uv_thread_create((uv_thread_t *)(lVar4 + (long)threads),worker,&uStack_48);
        lVar4 = lVar4 + 8;
      } while (iVar1 == 0);
    }
  }
LAB_003d0297:
  abort();
}

Assistant:

static void init_once(void) {
#ifndef _WIN32
  /* Re-initialize the threadpool after fork.
   * Note that this discards the global mutex and condition as well
   * as the work queue.
   */
  if (pthread_atfork(NULL, NULL, &reset_once))
    abort();
#endif
  init_threads();
}